

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.cpp
# Opt level: O1

IrrXMLReaderUTF16 * irr::io::createIrrXMLReaderUTF16(char *filename)

{
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this;
  CFileReadCallBack *this_00;
  
  this = (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)operator_new(0x88);
  this_00 = (CFileReadCallBack *)operator_new(0x18);
  CFileReadCallBack::CFileReadCallBack(this_00,filename);
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::CXMLReaderImpl
            (this,(IFileReadCallBack *)this_00,true);
  return &this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>;
}

Assistant:

IrrXMLReaderUTF16* createIrrXMLReaderUTF16(const char* filename)
{
	return new CXMLReaderImpl<char16, IXMLBase>(new CFileReadCallBack(filename)); 
}